

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BatchedMatMulLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_batchedmatmul(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  BatchedMatMulLayerParams *pBVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_batchedmatmul(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_batchedmatmul(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pBVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::BatchedMatMulLayerParams>(arena);
    (this->layer_).batchedmatmul_ = pBVar2;
  }
  return (BatchedMatMulLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchedMatMulLayerParams* NeuralNetworkLayer::_internal_mutable_batchedmatmul() {
  if (!_internal_has_batchedmatmul()) {
    clear_layer();
    set_has_batchedmatmul();
    layer_.batchedmatmul_ = CreateMaybeMessage< ::CoreML::Specification::BatchedMatMulLayerParams >(GetArenaForAllocation());
  }
  return layer_.batchedmatmul_;
}